

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ORA_ID_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  uVar2 = ReadWord(this,(ushort)bVar1);
  bVar1 = ReadByte(this,this->Y + uVar2);
  bVar1 = bVar1 | this->A;
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::ORA_ID_Y()
{
    cycles = 5;
    A |= ReadByte(ReadWord((uint16_t)(GetByte())) + Y);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}